

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::IsInternallyOn(char *val)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  string v;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (val == (char *)0x0) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,val,&local_39);
    if (local_38._M_string_length < 5) {
      for (uVar3 = 0; local_38._M_string_length != uVar3; uVar3 = uVar3 + 1) {
        iVar2 = toupper((int)local_38._M_dataplus._M_p[uVar3]);
        local_38._M_dataplus._M_p[uVar3] = (char)iVar2;
      }
      bVar1 = std::operator==(&local_38,"I_ON");
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  return bVar1;
}

Assistant:

bool cmSystemTools::IsInternallyOn(const char* val)
{
  if (!val) {
    return false;
  }
  std::string v = val;
  if (v.size() > 4) {
    return false;
  }

  for (char& c : v) {
    c = static_cast<char>(toupper(c));
  }
  return v == "I_ON";
}